

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=
          (Option<Catch::GroupInfo> *this,Option<Catch::GroupInfo> *_other)

{
  type tVar1;
  Option<Catch::GroupInfo> *in_RSI;
  Option<Catch::GroupInfo> *in_RDI;
  GroupInfo *in_stack_ffffffffffffffd8;
  Option<Catch::GroupInfo> *in_stack_ffffffffffffffe0;
  GroupInfo *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  tVar1 = Catch::Option::operator_cast_to_function_pointer((Option<Catch::GroupInfo> *)0x1e8297);
  if (tVar1 != 0) {
    this_00 = (GroupInfo *)in_RDI->storage;
    operator*(in_RSI);
    GroupInfo::GroupInfo(this_00,in_stack_ffffffffffffffd8);
    in_RDI->nullableValue = this_00;
  }
  return in_RDI;
}

Assistant:

Option& operator= ( Option const& _other ) {
            reset();
            if( _other )
                nullableValue = new( storage ) T( *_other );
            return *this;
        }